

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

int __thiscall
lzham::lzcompressor::raw_parse_thread_state::init(raw_parse_thread_state *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  node_state *pNodes;
  undefined1 auVar4 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar5;
  
  iVar2 = state::init(&this->m_state,ctx);
  auVar1 = _DAT_00111040;
  if ((char)iVar2 != '\0') {
    if (ctx[0x3976] == (EVP_PKEY_CTX)0x1) {
      lVar3 = 0xaa0;
      auVar4 = _DAT_00111020;
      auVar6 = _DAT_00111030;
      do {
        auVar7 = auVar6 ^ auVar1;
        if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffff3ff) {
          *(undefined4 *)((long)this + lVar3 + -0x558) = 0;
          *(undefined4 *)((long)this + lVar3 + -0x390) = 0;
        }
        auVar7 = auVar4 ^ auVar1;
        if (auVar7._4_4_ == -0x80000000 && auVar7._0_4_ < -0x7ffff3ff) {
          *(undefined4 *)((long)this + lVar3 + -0x1c8) = 0;
          *(undefined4 *)((long)(this->m_state).super_state_base.m_match_hist + lVar3 + -0x10) = 0;
        }
        lVar5 = auVar6._8_8_;
        auVar6._0_8_ = auVar6._0_8_ + 4;
        auVar6._8_8_ = lVar5 + 4;
        lVar5 = auVar4._8_8_;
        auVar4._0_8_ = auVar4._0_8_ + 4;
        auVar4._8_8_ = lVar5 + 4;
        lVar3 = lVar3 + 0x720;
      } while (lVar3 != 0x1571c0);
    }
    else {
      memset(this->m_nodes,0xff,0x2a038);
    }
  }
  return iVar2;
}

Assistant:

bool lzcompressor::raw_parse_thread_state::init(lzcompressor& lzcomp, const lzcompressor::init_params &params)
   {
      if (!m_state.init(lzcomp, params.m_table_max_update_interval, params.m_table_update_interval_slow_rate))
         return false;

      if (lzcomp.m_use_extreme_parsing)
      {
         for (uint j = 0; j < LZHAM_ARRAY_SIZE(m_nodes); j++)
            m_nodes[j].clear();
      }
      else
      {
         node_state *pNodes = reinterpret_cast<node_state*>(m_nodes);

         memset(pNodes, 0xFF, (1 + cMaxParseGraphNodes) * sizeof(node_state));
      }

      return true;
   }